

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Value.cpp
# Opt level: O0

complex<double> __thiscall soul::Value::PackedData::getAsComplex64(PackedData *this)

{
  bool bVar1;
  undefined8 extraout_RAX;
  undefined8 extraout_RAX_00;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  double __r;
  complex<double> cVar2;
  complex<float> local_28;
  PackedData *local_20;
  PackedData *this_local;
  
  local_20 = this;
  bVar1 = Type::isComplex64(this->type);
  if (bVar1) {
    cVar2 = getAs<std::complex<double>>(this);
  }
  else {
    bVar1 = Type::isComplex32(this->type);
    if (bVar1) {
      getAs<std::complex<float>>(this);
      std::complex<double>::complex((complex<double> *)&this_local,&local_28);
      cVar2._M_value._8_8_ = extraout_RDX;
      cVar2._M_value._0_8_ = extraout_RAX;
    }
    else {
      __r = getAsDouble(this);
      std::complex<double>::complex((complex<double> *)&this_local,__r,0.0);
      cVar2._M_value._8_8_ = extraout_RDX_00;
      cVar2._M_value._0_8_ = extraout_RAX_00;
    }
  }
  return (complex<double>)cVar2._M_value;
}

Assistant:

std::complex<double> getAsComplex64() const
    {
        if (type.isComplex64())  return getAs<std::complex<double>>();
        if (type.isComplex32())  return getAs<std::complex<float>>();

        return { getAsDouble(), 0.0 };
    }